

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Functional::Texture2DLodControlCase::iterate(Texture2DLodControlCase *this)

{
  ostringstream *this_00;
  TextureFormat TVar1;
  uint uVar2;
  RenderContext *context;
  TestLog *pTVar3;
  int width;
  int height;
  int i;
  int iVar4;
  int iVar5;
  deUint32 dVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  RenderTarget *pRVar8;
  long lVar9;
  int iVar10;
  Surface *pSVar11;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  char *description;
  int iVar12;
  void *pvVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  RandomViewport viewport;
  int local_450;
  Vector<int,_4> res;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_438 [2];
  undefined1 local_418 [40];
  undefined1 local_3f0 [40];
  TextureRenderer *local_3c8;
  Surface renderedFrame;
  vector<float,_std::allocator<float>_> texCoord;
  Surface referenceFrame;
  undefined1 local_378 [40];
  Surface errorMask;
  LodPrecision lodPrec;
  Texture2DView local_328;
  PixelFormat *local_318;
  Texture2D *local_310;
  Vector<int,_4> res_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  _Alloc_hider local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8 [6];
  undefined1 local_274 [24];
  undefined8 local_25c;
  size_type sStack_254;
  BVec4 local_24c;
  undefined1 local_248 [32];
  _Alloc_hider local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218 [4];
  ios_base local_1d0 [268];
  ReferenceParams sampleParams;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar4);
  local_310 = this->m_texture;
  iVar4 = (local_310->m_refTexture).m_width;
  iVar7 = (local_310->m_refTexture).m_height;
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  dVar6 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var_00,iVar5),iVar4 << 2,iVar7 << 2,dVar6);
  glu::mapGLSampler((Sampler *)local_248,0x2901,0x2901,this->m_minFilter,0x2600);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            (&sampleParams,TEXTURETYPE_2D,(Sampler *)local_248,LODMODE_EXACT);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tcu::Surface::Surface(&renderedFrame,viewport.width,viewport.height);
  iVar4 = viewport.width + 3;
  if (-1 < viewport.width) {
    iVar4 = viewport.width;
  }
  iVar7 = viewport.height + 3;
  if (-1 < viewport.height) {
    iVar7 = viewport.height;
  }
  (*this->m_texture->_vptr_Texture2D[2])();
  (**(code **)(lVar9 + 0xb8))(0xde1,this->m_texture->m_glTexture);
  (**(code **)(lVar9 + 0x1360))(0xde1,0x2802,0x2901);
  (**(code **)(lVar9 + 0x1360))(0xde1,0x2803,0x2901);
  (**(code **)(lVar9 + 0x1360))(0xde1,0x2801,this->m_minFilter);
  (**(code **)(lVar9 + 0x1360))(0xde1,0x2800,0x2600);
  dVar6 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar6,"After texture setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureMipmapTests.cpp"
                  ,0x5f5);
  iVar4 = iVar4 >> 2;
  iVar7 = iVar7 >> 2;
  local_3c8 = &this->m_renderer;
  local_450 = 0;
  iVar5 = 0;
  do {
    iVar17 = 0;
    iVar12 = 0;
    for (iVar14 = 0; iVar14 != 4; iVar14 = iVar14 + 1) {
      iVar10 = viewport.width + iVar12;
      if (iVar14 != 3) {
        iVar10 = iVar4;
      }
      iVar15 = viewport.height - iVar5 * iVar7;
      if (iVar5 != 3) {
        iVar15 = iVar7;
      }
      getBasicTexCoord2D(&texCoord,local_450 + iVar14);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                (this,(ulong)(uint)(local_450 + iVar14));
      (**(code **)(lVar9 + 0x1a00))(viewport.x + iVar17,viewport.y + iVar5 * iVar7,iVar10,iVar15);
      iVar12 = iVar12 - iVar4;
      iVar17 = iVar17 + iVar4;
      deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
                (local_3c8,0,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,&sampleParams.super_RenderParams);
    }
    iVar5 = iVar5 + 1;
    local_450 = local_450 + 4;
  } while (iVar5 != 4);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  res_1.m_data[0] = 8;
  res_1.m_data[1] = 3;
  pvVar13 = (void *)renderedFrame.m_pixels.m_cap;
  if (renderedFrame.m_pixels.m_cap != 0) {
    pvVar13 = renderedFrame.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_248,(TextureFormat *)&res_1,renderedFrame.m_width,
             renderedFrame.m_height,1,pvVar13);
  glu::readPixels(context,viewport.x,viewport.y,(PixelBufferAccess *)local_248);
  dVar6 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar6,"Read pixels",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureMipmapTests.cpp"
                  ,0x60d);
  pRVar8 = Context::getRenderTarget((this->super_TestCase).m_context);
  uVar2 = this->m_minFilter;
  tcu::Surface::Surface(&referenceFrame,viewport.width,viewport.height);
  tcu::Surface::Surface(&errorMask,viewport.width,viewport.height);
  local_318 = &pRVar8->m_pixelFormat;
  lVar9 = 0;
  do {
    *(undefined4 *)(local_274 + lVar9 * 4) = 0x16;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  lVar9 = 3;
  do {
    *(undefined4 *)(local_274 + lVar9 * 4) = 0x10;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 6);
  local_25c._0_4_ = 0.0;
  local_25c._4_4_ = 0.0;
  sStack_254._0_4_ = 0.0;
  sStack_254._4_4_ = 0.0;
  local_24c.m_data[0] = true;
  local_24c.m_data[1] = true;
  local_24c.m_data[2] = true;
  local_24c.m_data[3] = true;
  lodPrec.rule = RULE_OPENGL;
  lodPrec.derivateBits = 0x16;
  lodPrec.lodBits = 0x10;
  local_274._0_4_ = 0x14;
  local_274._4_4_ = 0x14;
  local_274._8_4_ = 0;
  local_274._12_4_ = 0x10;
  local_274._16_4_ = 0x10;
  local_274._20_4_ = 0;
  local_3f0._0_4_ = (pRVar8->m_pixelFormat).redBits;
  local_3f0._4_4_ = (pRVar8->m_pixelFormat).greenBits;
  local_3f0._8_4_ = (pRVar8->m_pixelFormat).blueBits;
  local_3f0._12_4_ = (pRVar8->m_pixelFormat).alphaBits;
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  res.m_data[2] = 0;
  res.m_data[3] = 0;
  lVar9 = 0;
  do {
    res.m_data[lVar9] = *(int *)(local_3f0 + lVar9 * 4) + ~(uint)((uVar2 & 0xfffffffe) == 0x2702);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  local_418._0_4_ = R;
  local_418._4_4_ = SNORM_INT8;
  local_418._8_8_ = 0;
  res_1.m_data[0] = 0;
  res_1.m_data[1] = 0;
  res_1.m_data[2] = 0;
  res_1.m_data[3] = 0;
  lVar9 = 0;
  do {
    iVar5 = *(int *)(local_418 + lVar9 * 4);
    if (*(int *)(local_418 + lVar9 * 4) < res.m_data[lVar9]) {
      iVar5 = res.m_data[lVar9];
    }
    res_1.m_data[lVar9] = iVar5;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  tcu::computeFixedPointThreshold((tcu *)local_248,&res_1);
  local_25c._0_4_ = (float)local_248._0_4_;
  local_25c._4_4_ = (float)local_248._4_4_;
  sStack_254 = local_248._8_8_;
  local_24c.m_data[1] = 0 < (pRVar8->m_pixelFormat).greenBits;
  local_24c.m_data[0] = 0 < (pRVar8->m_pixelFormat).redBits;
  local_24c.m_data[2] = 0 < (pRVar8->m_pixelFormat).blueBits;
  local_24c.m_data[3] = 0 < (pRVar8->m_pixelFormat).alphaBits;
  lodPrec.derivateBits = 10;
  lodPrec.lodBits = 8;
  iVar12 = 0;
  iVar14 = 0;
  iVar5 = 0;
  do {
    iVar17 = iVar14 * iVar7;
    iVar15 = 0;
    iVar10 = 0;
    iVar16 = 0;
    local_3c8 = (TextureRenderer *)CONCAT44(local_3c8._4_4_,iVar14);
    do {
      width = viewport.width + iVar10;
      if (iVar16 != 3) {
        width = iVar4;
      }
      height = viewport.height - iVar17;
      if (iVar14 != 3) {
        height = iVar7;
      }
      getBasicTexCoord2D(&texCoord,iVar12 + iVar16);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                (this,&sampleParams,(ulong)(uint)(iVar12 + iVar16));
      tcu::SurfaceAccess::SurfaceAccess
                ((SurfaceAccess *)local_248,&referenceFrame,local_318,iVar15,iVar17,width,height);
      res_1.m_data._8_8_ = (local_310->m_refTexture).m_view.m_levels;
      res_1.m_data[0] = (local_310->m_refTexture).m_view.m_numLevels;
      glu::TextureTestUtil::sampleTexture
                ((SurfaceAccess *)local_248,(Texture2DView *)&res_1,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,&sampleParams);
      res.m_data[0] = 8;
      res.m_data[1] = 3;
      pvVar13 = (void *)renderedFrame.m_pixels.m_cap;
      if (renderedFrame.m_pixels.m_cap != 0) {
        pvVar13 = renderedFrame.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&res_1,(TextureFormat *)&res,renderedFrame.m_width,
                 renderedFrame.m_height,1,pvVar13);
      tcu::getSubregion((PixelBufferAccess *)local_248,(PixelBufferAccess *)&res_1,iVar15,iVar17,
                        width,height);
      local_418._0_4_ = RGBA;
      local_418._4_4_ = UNORM_INT8;
      pvVar13 = (void *)referenceFrame.m_pixels.m_cap;
      if (referenceFrame.m_pixels.m_cap != 0) {
        pvVar13 = referenceFrame.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_3f0,(TextureFormat *)local_418,referenceFrame.m_width,
                 referenceFrame.m_height,1,pvVar13);
      tcu::getSubregion((PixelBufferAccess *)&res,(PixelBufferAccess *)local_3f0,iVar15,iVar17,width
                        ,height);
      local_328.m_numLevels = 8;
      local_328._4_4_ = 3;
      pvVar13 = (void *)errorMask.m_pixels.m_cap;
      if (errorMask.m_pixels.m_cap != 0) {
        pvVar13 = errorMask.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_378,(TextureFormat *)&local_328,errorMask.m_width,
                 errorMask.m_height,1,pvVar13);
      tcu::getSubregion((PixelBufferAccess *)local_418,(PixelBufferAccess *)local_378,iVar15,iVar17,
                        width,height);
      local_328.m_levels = (this->m_texture->m_refTexture).m_view.m_levels;
      local_328.m_numLevels = (this->m_texture->m_refTexture).m_view.m_numLevels;
      iVar14 = glu::TextureTestUtil::computeTextureLookupDiff
                         ((ConstPixelBufferAccess *)local_248,(ConstPixelBufferAccess *)&res,
                          (PixelBufferAccess *)local_418,&local_328,
                          texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,&sampleParams,
                          (LookupPrecision *)local_274,&lodPrec,
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                          m_watchDog);
      iVar16 = iVar16 + 1;
      iVar5 = iVar5 + iVar14;
      iVar10 = iVar10 - iVar4;
      iVar15 = iVar15 + iVar4;
      iVar14 = (int)local_3c8;
    } while (iVar16 != 4);
    iVar14 = (int)local_3c8 + 1;
    iVar12 = iVar12 + 4;
  } while (iVar14 != 4);
  if (0 < iVar5) {
    local_248._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_248 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"ERROR: Image verification failed, found ",0x28);
    std::ostream::operator<<(this_00,iVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," invalid pixels!",0x10);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_1d0);
  }
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  res.m_data._0_8_ = local_438;
  std::__cxx11::string::_M_construct<char_const*>((string *)&res,"Result","");
  local_3f0._0_8_ = (long)local_3f0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"Verification result","");
  tcu::LogImageSet::LogImageSet((LogImageSet *)&res_1,(string *)&res,(string *)local_3f0);
  tcu::TestLog::startImageSet(pTVar3,(char *)res_1.m_data._0_8_,local_2e8._M_p);
  local_418._0_8_ = (long)local_418 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"Rendered","");
  TVar1 = (TextureFormat)((long)local_378 + 0x10);
  local_378._0_8_ = TVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"Rendered image","");
  pSVar11 = &renderedFrame;
  tcu::LogImage::LogImage
            ((LogImage *)local_248,(string *)local_418,(string *)local_378,pSVar11,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_248,(int)pTVar3,__buf,(size_t)pSVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_p != local_218) {
    operator_delete(local_228._M_p,local_218[0]._M_allocated_capacity + 1);
  }
  if (local_248._0_8_ != (long)local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
  }
  if ((TextureFormat)local_378._0_8_ != TVar1) {
    operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
  }
  if (local_418._0_8_ != (long)local_418 + 0x10) {
    operator_delete((void *)local_418._0_8_,local_418._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_p != local_2d8) {
    operator_delete(local_2e8._M_p,local_2d8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)res_1.m_data._0_8_ != &local_2f8) {
    operator_delete((void *)res_1.m_data._0_8_,local_2f8._M_allocated_capacity + 1);
  }
  if (local_3f0._0_8_ != (long)local_3f0 + 0x10) {
    operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)res.m_data._0_8_ != local_438) {
    operator_delete((void *)res.m_data._0_8_,local_438[0]._M_allocated_capacity + 1);
  }
  if (0 < iVar5) {
    pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    res.m_data._0_8_ = local_438;
    std::__cxx11::string::_M_construct<char_const*>((string *)&res,"Reference","");
    local_3f0._0_8_ = (long)local_3f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"Ideal reference","");
    pSVar11 = &referenceFrame;
    tcu::LogImage::LogImage
              ((LogImage *)local_248,(string *)&res,(string *)local_3f0,pSVar11,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    iVar4 = (int)pTVar3;
    tcu::LogImage::write((LogImage *)local_248,iVar4,__buf_00,(size_t)pSVar11);
    local_418._0_8_ = (long)local_418 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"ErrorMask","");
    local_378._0_8_ = TVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"Error mask","");
    pSVar11 = &errorMask;
    tcu::LogImage::LogImage
              ((LogImage *)&res_1,(string *)local_418,(string *)local_378,pSVar11,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&res_1,iVar4,__buf_01,(size_t)pSVar11);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_p != local_2d8) {
      operator_delete(local_2e8._M_p,local_2d8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)res_1.m_data._0_8_ != &local_2f8) {
      operator_delete((void *)res_1.m_data._0_8_,local_2f8._M_allocated_capacity + 1);
    }
    if ((TextureFormat)local_378._0_8_ != TVar1) {
      operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
    }
    if (local_418._0_8_ != (long)local_418 + 0x10) {
      operator_delete((void *)local_418._0_8_,local_418._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_p != local_218) {
      operator_delete(local_228._M_p,local_218[0]._M_allocated_capacity + 1);
    }
    if (local_248._0_8_ != (long)local_248 + 0x10) {
      operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
    }
    if (local_3f0._0_8_ != (long)local_3f0 + 0x10) {
      operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)res.m_data._0_8_ != local_438) {
      operator_delete((void *)res.m_data._0_8_,local_438[0]._M_allocated_capacity + 1);
    }
  }
  tcu::TestLog::endImageSet(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log)
  ;
  description = "Pass";
  if (iVar5 != 0) {
    description = "Image verification failed";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(iVar5 != 0),
             description);
  tcu::Surface::~Surface(&errorMask);
  tcu::Surface::~Surface(&referenceFrame);
  tcu::Surface::~Surface(&renderedFrame);
  if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return STOP;
}

Assistant:

Texture2DLodControlCase::IterateResult Texture2DLodControlCase::iterate (void)
{
	const glw::Functions&		gl					= m_context.getRenderContext().getFunctions();

	const deUint32				wrapS				= GL_REPEAT;
	const deUint32				wrapT				= GL_REPEAT;
	const deUint32				magFilter			= GL_NEAREST;

	const tcu::Texture2D&		refTexture			= m_texture->getRefTexture();
	const int					texWidth			= refTexture.getWidth();
	const int					texHeight			= refTexture.getHeight();

	const tcu::RenderTarget&	renderTarget		= m_context.getRenderContext().getRenderTarget();
	const RandomViewport		viewport			(renderTarget, texWidth*4, texHeight*4, deStringHash(getName()));

	ReferenceParams				sampleParams		(TEXTURETYPE_2D, glu::mapGLSampler(wrapS, wrapT, m_minFilter, magFilter));
	vector<float>				texCoord;
	tcu::Surface				renderedFrame		(viewport.width, viewport.height);

	// Viewport is divided into 4x4 grid.
	const int					gridWidth			= 4;
	const int					gridHeight			= 4;
	const int					cellWidth			= viewport.width / gridWidth;
	const int					cellHeight			= viewport.height / gridHeight;

	// Upload texture data.
	m_texture->upload();

	// Bind gradient texture and setup sampler parameters.
	gl.bindTexture	(GL_TEXTURE_2D, m_texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		wrapS);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		wrapT);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	magFilter);

	GLU_EXPECT_NO_ERROR(gl.getError(), "After texture setup");

	// Render cells.
	for (int gridY = 0; gridY < gridHeight; gridY++)
	{
		for (int gridX = 0; gridX < gridWidth; gridX++)
		{
			int				curX		= cellWidth*gridX;
			int				curY		= cellHeight*gridY;
			int				curW		= gridX+1 == gridWidth ? (viewport.width-curX) : cellWidth;
			int				curH		= gridY+1 == gridHeight ? (viewport.height-curY) : cellHeight;
			int				cellNdx		= gridY*gridWidth + gridX;

			// Compute texcoord.
			getBasicTexCoord2D(texCoord, cellNdx);

			// Render with GL.
			setTextureParams(cellNdx);
			gl.viewport(viewport.x+curX, viewport.y+curY, curW, curH);
			m_renderer.renderQuad(0, &texCoord[0], sampleParams);
		}
	}

	glu::readPixels(m_context.getRenderContext(), viewport.x, viewport.y, renderedFrame.getAccess());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels");

	// Compare and log.
	{
		const tcu::PixelFormat&	pixelFormat		= m_context.getRenderTarget().getPixelFormat();
		const bool				isTrilinear		= m_minFilter == GL_NEAREST_MIPMAP_LINEAR || m_minFilter == GL_LINEAR_MIPMAP_LINEAR;
		tcu::Surface			referenceFrame	(viewport.width, viewport.height);
		tcu::Surface			errorMask		(viewport.width, viewport.height);
		tcu::LookupPrecision	lookupPrec;
		tcu::LodPrecision		lodPrec			(tcu::LodPrecision::RULE_OPENGL);
		int						numFailedPixels	= 0;

		lookupPrec.coordBits		= tcu::IVec3(20, 20, 0);
		lookupPrec.uvwBits			= tcu::IVec3(16, 16, 0); // Doesn't really matter since pixels are unicolored.
		lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(max(getBitsVec(pixelFormat) - (isTrilinear ? 2 : 1), tcu::IVec4(0)));
		lookupPrec.colorMask		= getCompareMask(pixelFormat);
		lodPrec.derivateBits		= 10;
		lodPrec.lodBits				= 8;

		for (int gridY = 0; gridY < gridHeight; gridY++)
		{
			for (int gridX = 0; gridX < gridWidth; gridX++)
			{
				const int		curX		= cellWidth*gridX;
				const int		curY		= cellHeight*gridY;
				const int		curW		= gridX+1 == gridWidth ? (viewport.width-curX) : cellWidth;
				const int		curH		= gridY+1 == gridHeight ? (viewport.height-curY) : cellHeight;
				const int		cellNdx		= gridY*gridWidth + gridX;

				getBasicTexCoord2D(texCoord, cellNdx);
				getReferenceParams(sampleParams, cellNdx);

				// Render ideal result
				sampleTexture(tcu::SurfaceAccess(referenceFrame, pixelFormat, curX, curY, curW, curH),
							  refTexture, &texCoord[0], sampleParams);

				// Compare this cell
				numFailedPixels += computeTextureLookupDiff(tcu::getSubregion(renderedFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(referenceFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(errorMask.getAccess(), curX, curY, curW, curH),
															m_texture->getRefTexture(), &texCoord[0], sampleParams,
															lookupPrec, lodPrec, m_testCtx.getWatchDog());
			}
		}

		if (numFailedPixels > 0)
			m_testCtx.getLog() << TestLog::Message << "ERROR: Image verification failed, found " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;

		m_testCtx.getLog() << TestLog::ImageSet("Result", "Verification result")
							<< TestLog::Image("Rendered", "Rendered image", renderedFrame);

		if (numFailedPixels > 0)
		{
			m_testCtx.getLog() << TestLog::Image("Reference", "Ideal reference", referenceFrame)
								<< TestLog::Image("ErrorMask", "Error mask", errorMask);
		}

		m_testCtx.getLog() << TestLog::EndImageSet;

		{
			const bool isOk = numFailedPixels == 0;
			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image verification failed");
		}
	}

	return STOP;
}